

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::
log_<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffb98;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffba0;
  basic_appender<char> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffbd8;
  level_enum in_stack_fffffffffffffbfc;
  log_msg *in_stack_fffffffffffffc00;
  string_view_t in_stack_fffffffffffffc08;
  string_view_t in_stack_fffffffffffffc18;
  source_loc in_stack_fffffffffffffc30;
  basic_string_view<char> local_378 [2];
  undefined8 local_358;
  undefined8 uStack_350;
  log_msg *local_348;
  buffer<char> *local_2e0;
  undefined1 local_2d8 [32];
  undefined8 local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  basic_appender<char> local_290 [4];
  buffer<char> local_270 [9];
  undefined1 local_14a;
  byte local_149;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  
  pcVar1 = &stack0x00000008;
  local_148 = in_R9;
  local_140 = in_R8;
  local_128 = in_RDX;
  uStack_120 = in_RCX;
  local_149 = should_log(in_stack_fffffffffffffb98,
                         (level_enum)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  local_14a = details::backtracer::enabled((backtracer *)0x6a8363);
  if (((local_149 & 1) != 0) || ((bool)local_14a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffb90,(allocator<char> *)in_stack_fffffffffffffb88);
    ::fmt::v11::basic_appender<char>::basic_appender(local_290,local_270);
    local_2a8 = local_128;
    uStack_2a0 = uStack_120;
    local_48 = local_140;
    local_50 = local_148;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffba0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb98);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffba0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb98);
    local_38 = &local_2b8;
    local_40 = local_2d8;
    local_2b8 = 0xdd;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffbd4;
    args_00.desc_._0_4_ = in_stack_fffffffffffffbd0;
    args_00.field_1.values_ = in_stack_fffffffffffffbd8.values_;
    local_2b0 = local_40;
    local_2e0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffbc8,fmt_00,args_00);
    local_348 = *(log_msg **)(pcVar1 + 0x10);
    local_358 = *(undefined8 *)pcVar1;
    uStack_350 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_270);
    count = ::fmt::v11::detail::buffer<char>::size(local_270);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_378,pcVar1,count);
    uVar2 = uStack_350;
    log_msg_00 = local_348;
    details::log_msg::log_msg
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffc30,in_stack_fffffffffffffc18,
               in_stack_fffffffffffffbfc,in_stack_fffffffffffffc08);
    log_it_(in_stack_fffffffffffffba0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x6a8586);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }